

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMeshShape.cpp
# Opt level: O1

cbtVector3 __thiscall
cbtTriangleMeshShape::localGetSupportingVertex(cbtTriangleMeshShape *this,cbtVector3 *vec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  cbtVector3 cVar8;
  cbtVector3 aabbMax;
  cbtTriangleCallback local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined4 local_20;
  undefined1 local_1c [16];
  
  local_5c = 0;
  uStack_54 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_78._vptr_cbtTriangleCallback = (_func_int **)&PTR__cbtTriangleCallback_00b71558;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0x3f800000;
  local_4c = 0x3f800000;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0x3f800000;
  local_20 = 0xdd5e0b6b;
  fVar1 = vec->m_floats[0];
  fVar2 = vec->m_floats[1];
  fVar3 = vec->m_floats[2];
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 + fVar2 * 0.0)),ZEXT416((uint)fVar3),ZEXT416(0));
  auVar7 = vfmadd132ss_fma(ZEXT416(0),ZEXT416((uint)fVar2),ZEXT416((uint)fVar1));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar3),ZEXT416(0));
  auVar7 = vinsertps_avx(auVar4,auVar7,0x10);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * 0.0)),ZEXT416((uint)fVar1),ZEXT416(0));
  local_1c = vinsertps_avx(auVar7,ZEXT416((uint)(fVar3 + auVar4._0_4_)),0x28);
  auVar7._8_4_ = 0xdd5e0b6b;
  auVar7._0_8_ = 0xdd5e0b6bdd5e0b6b;
  auVar7._12_4_ = 0xdd5e0b6b;
  vmovlhps_avx(auVar7,SUB6416(ZEXT464(0xdd5e0b6b),0));
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])();
  uVar6 = uStack_68;
  uVar5 = local_70;
  cbtTriangleCallback::~cbtTriangleCallback(&local_78);
  uStack_68._0_4_ = (undefined4)uVar6;
  uStack_68._4_4_ = SUB84(uVar6,4);
  cVar8.m_floats[2] = (cbtScalar)(undefined4)uStack_68;
  cVar8.m_floats[3] = (cbtScalar)uStack_68._4_4_;
  local_70._0_4_ = (undefined4)uVar5;
  local_70._4_4_ = SUB84(uVar5,4);
  cVar8.m_floats[0] = (cbtScalar)(undefined4)local_70;
  cVar8.m_floats[1] = (cbtScalar)local_70._4_4_;
  return (cbtVector3)cVar8.m_floats;
}

Assistant:

cbtVector3 cbtTriangleMeshShape::localGetSupportingVertex(const cbtVector3& vec) const
{
	cbtVector3 supportVertex;

	cbtTransform ident;
	ident.setIdentity();

	SupportVertexCallback supportCallback(vec, ident);

	cbtVector3 aabbMax(cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT));

	processAllTriangles(&supportCallback, -aabbMax, aabbMax);

	supportVertex = supportCallback.GetSupportVertexLocal();

	return supportVertex;
}